

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dunk.c
# Opt level: O0

void envy_bios_print_cinema(envy_bios *bios,FILE *out,uint mask)

{
  envy_bios_cinema *peVar1;
  int local_2c;
  int i;
  envy_bios_cinema *cinema;
  uint mask_local;
  FILE *out_local;
  envy_bios *bios_local;
  
  peVar1 = &bios->cinema;
  if ((peVar1->offset != 0) && ((mask & 0x400000) != 0)) {
    if ((bios->cinema).valid == '\0') {
      fprintf((FILE *)out,"Failed to parse CINEMA table at 0x%04x version %d.%d\n\n",
              (ulong)peVar1->offset,(ulong)(uint)((int)(uint)(bios->cinema).version >> 4),
              (ulong)((bios->cinema).version & 0xf));
    }
    else {
      fprintf((FILE *)out,"CINEMA table at 0x%04x version %d.%d data",(ulong)peVar1->offset,
              (ulong)(uint)((int)(uint)(bios->cinema).version >> 4),
              (ulong)((bios->cinema).version & 0xf));
      for (local_2c = 0; local_2c < 10; local_2c = local_2c + 1) {
        fprintf((FILE *)out," 0x%02x",(ulong)(bios->cinema).unk02[local_2c]);
      }
      fprintf((FILE *)out,"\n");
      envy_bios_dump_hex(bios,out,(uint)peVar1->offset,(uint)(bios->cinema).hlen,mask);
      fprintf((FILE *)out,"\n");
    }
  }
  return;
}

Assistant:

void envy_bios_print_cinema (struct envy_bios *bios, FILE *out, unsigned mask) {
	struct envy_bios_cinema *cinema = &bios->cinema;
	if (!cinema->offset || !(mask & ENVY_BIOS_PRINT_DUNK))
		return;
	if (!cinema->valid) {
		fprintf(out, "Failed to parse CINEMA table at 0x%04x version %d.%d\n\n", cinema->offset, cinema->version >> 4, cinema->version & 0xf);
		return;
	}
	fprintf(out, "CINEMA table at 0x%04x version %d.%d data", cinema->offset, cinema->version >> 4, cinema->version & 0xf);
	int i;
	for (i = 0; i < 10; i++)
		fprintf(out, " 0x%02x", cinema->unk02[i]);
	fprintf(out, "\n");
	envy_bios_dump_hex(bios, out, cinema->offset, cinema->hlen, mask);
	fprintf(out, "\n");
}